

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void print_type_segment_info(type_segment sec)

{
  type_pointer pfVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < sec.type_segment_count) {
    uVar3 = 0;
    do {
      pfVar1 = sec.type_segment_addr + uVar3;
      printf("  - type[%d]:",uVar3 & 0xffffffff);
      putchar(0x28);
      if (sec.type_segment_addr[uVar3].param_count != 0) {
        uVar4 = 0;
        do {
          if (uVar4 != 0) {
            putchar(0x2c);
          }
          pcVar2 = val_type(pfVar1->param_types[uVar4]);
          printf("%s",pcVar2);
          uVar4 = uVar4 + 1;
        } while (uVar4 < pfVar1->param_count);
      }
      printf(")->(");
      if (pfVar1->return_count != 0) {
        uVar4 = 0;
        do {
          if (uVar4 != 0) {
            putchar(0x2c);
          }
          pcVar2 = val_type(pfVar1->return_types[uVar4]);
          printf("%s",pcVar2);
          uVar4 = uVar4 + 1;
        } while (uVar4 < pfVar1->return_count);
      }
      puts(")");
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)sec.type_segment_count);
  }
  return;
}

Assistant:

void print_type_segment_info(type_segment sec) {
    type_pointer type_segment_addr;
    for (int i = 0; i < sec.type_segment_count; ++i) {
        type_segment_addr = sec.type_segment_addr + i;
        printf("  - type[%d]:", i);
        printf("(");
        for (int j = 0; j < type_segment_addr->param_count; ++j) {
            if (j)printf(",");
            printf("%s", val_type(*(type_segment_addr->param_types + j)));
        }
        printf(")->(");
        for (int j = 0; j < type_segment_addr->return_count; ++j) {
            if (j)printf(",");
            printf("%s", val_type(*(type_segment_addr->return_types + j)));
        }
        printf(")\n");
    }
}